

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::Dress(Character *this,EquipLocation loc,unsigned_short gfx_id)

{
  Character *other;
  bool bVar1;
  uint uVar2;
  undefined6 in_register_00000012;
  list<Character_*,_std::allocator<Character_*>_> *plVar3;
  _List_node_base *p_Var4;
  PacketBuilder builder;
  
  uVar2 = (uint)CONCAT62(in_register_00000012,gfx_id);
  (this->cosmetic_paperdoll)._M_elems[loc] = (-(uint)(uVar2 == 0) | uVar2) & 0xffff;
  PacketBuilder::PacketBuilder(&builder,PACKET_AVATAR,PACKET_AGREE,0xe);
  PacketBuilder::AddShort(&builder,this->player->id);
  PacketBuilder::AddChar(&builder,1);
  PacketBuilder::AddChar(&builder,0);
  AddPaperdollData(this,&builder,"BAHWS");
  plVar3 = &this->map->characters;
  p_Var4 = (_List_node_base *)plVar3;
  while (p_Var4 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var4->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar3) {
    other = (Character *)p_Var4[1]._M_next;
    bVar1 = InRange(this,other);
    if (bVar1) {
      Send(other,&builder);
    }
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Character::Dress(EquipLocation loc, unsigned short gfx_id)
{
	if (gfx_id == 0)
		gfx_id = 65535;

	this->cosmetic_paperdoll[loc] = gfx_id;

	PacketBuilder builder(PACKET_AVATAR, PACKET_AGREE, 14);
	builder.AddShort(this->PlayerID());
	builder.AddChar(SLOT_CLOTHES);
	builder.AddChar(0); // sound
	this->AddPaperdollData(builder, "BAHWS");

	UTIL_FOREACH(this->map->characters, updatecharacter)
	{
		if (!this->InRange(updatecharacter))
			continue;

		updatecharacter->Send(builder);
	}
}